

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_115e484::ActivityObserver::register_drive(ActivityObserver *this,string *name)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock_guard;
  string *name_local;
  ActivityObserver *this_local;
  
  lock_guard._M_device = (mutex_type *)name;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->drives_,(value_type *)lock_guard._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void register_drive(const std::string &name) final {
			std::lock_guard lock_guard(mutex);
			drives_.push_back(name);
		}